

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O1

void __thiscall ftxui::TerminalInputParser::Timeout(TerminalInputParser *this,int time)

{
  Output output;
  int iVar1;
  undefined4 uStack_14;
  undefined8 uStack_10;
  undefined8 local_8;
  
  iVar1 = time + this->timeout_;
  this->timeout_ = iVar1;
  if ((0x31 < iVar1) && (this->timeout_ = 0, (this->pending_)._M_string_length != 0)) {
    output.field_1.mouse.button = uStack_14;
    output.type = 3;
    output.field_1._4_8_ = uStack_10;
    output.field_1._12_8_ = local_8;
    Send(this,output);
  }
  return;
}

Assistant:

void TerminalInputParser::Timeout(int time) {
  timeout_ += time;
  if (timeout_ < 50)
    return;
  timeout_ = 0;
  if (pending_.size())
    Send(SPECIAL);
}